

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kd_tree_attributes_decoder.cc
# Opt level: O2

bool __thiscall
draco::KdTreeAttributesDecoder::TransformAttributesToOriginalFormat(KdTreeAttributesDecoder *this)

{
  byte bVar1;
  DataType DVar2;
  int32_t iVar3;
  PointAttribute *att;
  pointer pAVar4;
  DracoOptions<draco::GeometryAttribute::Type> *this_00;
  long lVar5;
  long lVar6;
  bool bVar7;
  bool bVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  undefined4 extraout_var;
  long lVar12;
  undefined4 extraout_var_00;
  uint uVar13;
  long lVar14;
  ulong uVar15;
  ulong uVar16;
  long lVar17;
  allocator_type local_ad;
  int local_ac;
  PointAttribute *local_a8;
  int local_9c;
  _Head_base<0UL,_draco::PointAttribute_*,_false> local_98;
  uint local_8c;
  ulong local_88;
  vector<unsigned_int,_std::allocator<unsigned_int>_> unsigned_val;
  vector<int,_std::allocator<int>_> signed_val;
  
  if (((this->quantized_portable_attributes_).
       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->quantized_portable_attributes_).
       super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start ==
      (this->min_signed_values_).super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish)) {
    bVar8 = true;
  }
  else {
    uVar15 = 0;
    local_ac = 0;
    local_9c = 0;
    while( true ) {
      iVar9 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                _vptr_AttributesDecoderInterface[6])(this);
      bVar8 = iVar9 <= (int)uVar15;
      if (iVar9 <= (int)uVar15) break;
      iVar10 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[5])(this,uVar15);
      iVar11 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                 _vptr_AttributesDecoderInterface[7])(this);
      iVar9 = local_9c;
      att = *(PointAttribute **)
             (*(long *)(*(long *)(CONCAT44(extraout_var,iVar11) + 8) + 0x10) + (long)iVar10 * 8);
      DVar2 = (att->super_GeometryAttribute).data_type_;
      local_a8 = att;
      if (DVar2 - DT_INT8 < 9) {
        switch(DVar2) {
        case DT_INT8:
        case DT_INT16:
        case DT_INT32:
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
                    (&unsigned_val,(ulong)(att->super_GeometryAttribute).num_components_,
                     (allocator_type *)&signed_val);
          std::vector<int,_std::allocator<int>_>::vector
                    (&signed_val,(ulong)(att->super_GeometryAttribute).num_components_,&local_ad);
          DVar2 = (att->super_GeometryAttribute).data_type_;
          if (DVar2 == DT_INT8) {
            bVar7 = TransformAttributeBackToSignedType<signed_char>(this,att,local_ac);
LAB_00137fd6:
            if (bVar7 != false) goto LAB_00137fda;
            bVar7 = false;
          }
          else {
            if (DVar2 == DT_INT16) {
              bVar7 = TransformAttributeBackToSignedType<short>(this,att,local_ac);
              goto LAB_00137fd6;
            }
            if (DVar2 == DT_INT32) {
              bVar7 = TransformAttributeBackToSignedType<int>(this,att,local_ac);
              goto LAB_00137fd6;
            }
LAB_00137fda:
            local_ac = local_ac + (uint)(att->super_GeometryAttribute).num_components_;
            bVar7 = true;
          }
          std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                    ((_Vector_base<int,_std::allocator<int>_> *)&signed_val);
          std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
                    (&unsigned_val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
          if (!bVar7) {
            return bVar8;
          }
          break;
        case DT_FLOAT32:
          lVar12 = (long)local_9c;
          local_98._M_head_impl =
               *(PointAttribute **)
                &(this->quantized_portable_attributes_).
                 super__Vector_base<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>,_std::allocator<std::unique_ptr<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[lVar12]._M_t.
                 super___uniq_ptr_impl<draco::PointAttribute,_std::default_delete<draco::PointAttribute>_>
                 ._M_t;
          pAVar4 = (this->attribute_quantization_transforms_).
                   super__Vector_base<draco::AttributeQuantizationTransform,_std::allocator<draco::AttributeQuantizationTransform>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_88 = uVar15;
          iVar10 = (*(this->super_AttributesDecoder).super_AttributesDecoderInterface.
                     _vptr_AttributesDecoderInterface[7])(this);
          this_00 = *(DracoOptions<draco::GeometryAttribute::Type> **)
                     (CONCAT44(extraout_var_00,iVar10) + 0x50);
          signed_val.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
          _M_start._0_4_ = (float)(local_a8->super_GeometryAttribute).attribute_type_;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&unsigned_val,"skip_attribute_transform",(allocator<char> *)&local_ad
                    );
          bVar8 = DracoOptions<draco::GeometryAttribute::Type>::GetAttributeBool
                            (this_00,(AttributeKey *)&signed_val,(string *)&unsigned_val,false);
          std::__cxx11::string::~string((string *)&unsigned_val);
          local_9c = iVar9 + 1;
          if (bVar8) {
            PointAttribute::CopyFrom(local_a8,local_98._M_head_impl);
            uVar15 = local_88;
          }
          else {
            iVar3 = pAVar4[lVar12].quantization_bits_;
            bVar1 = (local_a8->super_GeometryAttribute).num_components_;
            uVar15 = (ulong)((uint)bVar1 * 4);
            unsigned_val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start = (pointer)operator_new__(uVar15);
            Dequantizer::Dequantizer((Dequantizer *)&signed_val);
            bVar8 = Dequantizer::Init((Dequantizer *)&signed_val,pAVar4[lVar12].range_,
                                      ~(-1 << ((byte)iVar3 & 0x1f)));
            if (!bVar8) {
              std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
                        ((unique_ptr<float[],_std::default_delete<float[]>_> *)&unsigned_val);
              return false;
            }
            lVar5 = (long)((((local_98._M_head_impl)->super_GeometryAttribute).buffer_)->data_).
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start;
            lVar6 = ((local_98._M_head_impl)->super_GeometryAttribute).byte_offset_;
            lVar14 = 0;
            lVar17 = 0;
            uVar13 = 0;
            while (uVar13 < (local_98._M_head_impl)->num_unique_entries_) {
              for (uVar16 = 0; bVar1 != uVar16; uVar16 = uVar16 + 1) {
                unsigned_val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start[uVar16] =
                     (uint)((float)*(int *)(lVar5 + lVar6 + (long)(int)lVar17 * 4 + uVar16 * 4) *
                            signed_val.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start._0_4_ +
                           *(float *)(*(long *)&pAVar4[lVar12].min_values_.
                                                super__Vector_base<float,_std::allocator<float>_>.
                                                _M_impl.super__Vector_impl_data + uVar16 * 4));
              }
              local_8c = uVar13;
              memcpy((void *)(*(long *)&(((local_a8->attribute_buffer_)._M_t.
                                          super___uniq_ptr_impl<draco::DataBuffer,_std::default_delete<draco::DataBuffer>_>
                                          ._M_t.
                                          super__Tuple_impl<0UL,_draco::DataBuffer_*,_std::default_delete<draco::DataBuffer>_>
                                          .super__Head_base<0UL,_draco::DataBuffer_*,_false>.
                                         _M_head_impl)->data_).
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                             + lVar14),
                     unsigned_val.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start,uVar15);
              lVar14 = lVar14 + uVar15;
              lVar17 = (long)(int)lVar17 + uVar16;
              uVar13 = local_8c + 1;
            }
            std::unique_ptr<float[],_std::default_delete<float[]>_>::~unique_ptr
                      ((unique_ptr<float[],_std::default_delete<float[]>_> *)&unsigned_val);
            uVar15 = local_88;
          }
        }
      }
      uVar15 = (ulong)((int)uVar15 + 1);
    }
  }
  return bVar8;
}

Assistant:

bool KdTreeAttributesDecoder::TransformAttributesToOriginalFormat() {
  if (quantized_portable_attributes_.empty() && min_signed_values_.empty()) {
    return true;
  }
  int num_processed_quantized_attributes = 0;
  int num_processed_signed_components = 0;
  // Dequantize attributes that needed it.
  for (int i = 0; i < GetNumAttributes(); ++i) {
    const int att_id = GetAttributeId(i);
    PointAttribute *const att = GetDecoder()->point_cloud()->attribute(att_id);
    if (att->data_type() == DT_INT32 || att->data_type() == DT_INT16 ||
        att->data_type() == DT_INT8) {
      std::vector<uint32_t> unsigned_val(att->num_components());
      std::vector<int32_t> signed_val(att->num_components());
      // Values are stored as unsigned in the attribute, make them signed again.
      if (att->data_type() == DT_INT32) {
        if (!TransformAttributeBackToSignedType<int32_t>(
                att, num_processed_signed_components)) {
          return false;
        }
      } else if (att->data_type() == DT_INT16) {
        if (!TransformAttributeBackToSignedType<int16_t>(
                att, num_processed_signed_components)) {
          return false;
        }
      } else if (att->data_type() == DT_INT8) {
        if (!TransformAttributeBackToSignedType<int8_t>(
                att, num_processed_signed_components)) {
          return false;
        }
      }
      num_processed_signed_components += att->num_components();
    } else if (att->data_type() == DT_FLOAT32) {
      // TODO(ostava): This code should be probably moved out to attribute
      // transform and shared with the SequentialQuantizationAttributeDecoder.

      const PointAttribute *const src_att =
          quantized_portable_attributes_[num_processed_quantized_attributes]
              .get();

      const AttributeQuantizationTransform &transform =
          attribute_quantization_transforms_
              [num_processed_quantized_attributes];

      num_processed_quantized_attributes++;

      if (GetDecoder()->options()->GetAttributeBool(
              att->attribute_type(), "skip_attribute_transform", false)) {
        // Attribute transform should not be performed. In this case, we replace
        // the output geometry attribute with the portable attribute.
        // TODO(ostava): We can potentially avoid this copy by introducing a new
        // mechanism that would allow to use the final attributes as portable
        // attributes for predictors that may need them.
        att->CopyFrom(*src_att);
        continue;
      }

      // Convert all quantized values back to floats.
      const int32_t max_quantized_value =
          (1u << static_cast<uint32_t>(transform.quantization_bits())) - 1;
      const int num_components = att->num_components();
      const int entry_size = sizeof(float) * num_components;
      const std::unique_ptr<float[]> att_val(new float[num_components]);
      int quant_val_id = 0;
      int out_byte_pos = 0;
      Dequantizer dequantizer;
      if (!dequantizer.Init(transform.range(), max_quantized_value)) {
        return false;
      }
      const uint32_t *const portable_attribute_data =
          reinterpret_cast<const uint32_t *>(
              src_att->GetAddress(AttributeValueIndex(0)));
      for (uint32_t i = 0; i < src_att->size(); ++i) {
        for (int c = 0; c < num_components; ++c) {
          float value = dequantizer.DequantizeFloat(
              portable_attribute_data[quant_val_id++]);
          value = value + transform.min_value(c);
          att_val[c] = value;
        }
        // Store the floating point value into the attribute buffer.
        att->buffer()->Write(out_byte_pos, att_val.get(), entry_size);
        out_byte_pos += entry_size;
      }
    }
  }
  return true;
}